

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O1

void capnp::compiler::anon_unknown_0::checkExampleField
               (Reader reader,Field field,uint sharedOrdinalCount)

{
  Reader type;
  Reader reader_00;
  Field field_00;
  short sVar1;
  uint ordinal;
  uint sharedOrdinalCount_00;
  Reader *this;
  ReaderFor<DynamicStruct> local_128;
  StructReader local_f0;
  SegmentReader *local_c0;
  undefined8 local_b8;
  undefined8 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5c [52];
  
  if (field.proto._reader.dataSize < 0x50) {
    sVar1 = 0;
  }
  else {
    sVar1 = *(short *)((long)field.proto._reader.data + 8);
  }
  if (sVar1 == 1) {
    DynamicStruct::Reader::get((Reader *)&local_c0,&reader,field);
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              (&local_128,(Reader *)&local_c0);
    reader_00.reader.segment = local_128.reader.segment;
    reader_00.schema.super_Schema.raw = local_128.schema.super_Schema.raw;
    reader_00.reader.capTable = local_128.reader.capTable;
    reader_00.reader.data = local_128.reader.data;
    reader_00.reader.pointers = local_128.reader.pointers;
    reader_00.reader.dataSize = local_128.reader.dataSize;
    reader_00.reader.pointerCount = local_128.reader.pointerCount;
    reader_00.reader._38_2_ = local_128.reader._38_2_;
    reader_00.reader.nestingLimit = local_128.reader.nestingLimit;
    reader_00.reader._44_4_ = local_128.reader._44_4_;
    checkExampleStruct(reader_00,sharedOrdinalCount);
    this = (Reader *)&local_c0;
  }
  else {
    if (sVar1 != 0) {
      return;
    }
    field_00.index = in_stack_ffffffffffffff58;
    field_00.parent.super_Schema.raw = (Schema)(Schema)in_stack_ffffffffffffff50;
    field_00._12_52_ = in_stack_ffffffffffffff5c;
    ordinal = getOrdinal(field_00);
    if (sharedOrdinalCount <= ordinal) {
      return;
    }
    DynamicStruct::Reader::get((Reader *)&stack0xffffffffffffff88,&reader,field);
    if (field.proto._reader.pointerCount < 3) {
      field.proto._reader.capTable = (CapTableReader *)0x0;
      field.proto._reader.segment = (SegmentReader *)0x0;
    }
    local_c0 = field.proto._reader.segment;
    local_b8 = field.proto._reader.capTable;
    _::PointerReader::getStruct(&local_f0,(PointerReader *)&local_c0,(word *)0x0);
    type._reader.capTable = local_f0.capTable;
    type._reader.segment = local_f0.segment;
    type._reader.data = local_f0.data;
    type._reader.pointers = local_f0.pointers;
    type._reader.dataSize = local_f0.dataSize;
    type._reader.pointerCount = local_f0.pointerCount;
    type._reader._38_2_ = local_f0._38_2_;
    type._reader.nestingLimit = local_f0.nestingLimit;
    type._reader._44_4_ = local_f0._44_4_;
    checkExampleValue((Reader *)&stack0xffffffffffffff88,ordinal,type,sharedOrdinalCount_00);
    this = (Reader *)&stack0xffffffffffffff88;
  }
  DynamicValue::Reader::~Reader(this);
  return;
}

Assistant:

void checkExampleField(DynamicStruct::Reader reader, StructSchema::Field field,
                       uint sharedOrdinalCount) {
  auto fieldProto = field.getProto();
  switch (fieldProto.which()) {
    case schema::Field::SLOT: {
      uint ordinal = getOrdinal(field);
      if (ordinal < sharedOrdinalCount) {
        checkExampleValue(reader.get(field), ordinal,
                          fieldProto.getSlot().getType(), sharedOrdinalCount);
      }
      break;
    }
    case schema::Field::GROUP:
      checkExampleStruct(reader.get(field).as<DynamicStruct>(), sharedOrdinalCount);
      break;
  }
}